

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O3

int do_mov(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char *pcVar5;
  vm_register *pvVar6;
  undefined4 *puVar7;
  uint *puVar8;
  undefined2 uVar9;
  short sVar10;
  uint uVar11;
  byte bVar12;
  char cVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  
  pcVar5 = data_ptr;
  pvVar6 = registe_ptr;
  uVar11 = registe_ptr->IP;
  if (10 < (code_ptr[uVar11 + 1] & 0xfU)) {
switchD_00102dc6_caseD_4:
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0xf6;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  bVar1 = code_ptr[uVar11 + 2];
  bVar2 = bVar1 >> 4;
  bVar12 = bVar1 & 0xf;
  switch(code_ptr[uVar11 + 1] & 0xfU) {
  case 0:
    bVar3 = (byte)code_ptr[uVar11 + 3] >> 4;
    if (bVar12 == 2) {
      puVar8 = register_list[bVar2];
      uVar11 = *register_list[bVar3];
LAB_001032cd:
      *puVar8 = uVar11;
      bVar17 = (int)uVar11 < 0;
      bVar16 = uVar11 == 0;
      goto joined_r0x001032d1;
    }
    if (bVar12 != 1) {
      if ((bVar1 & 0xf) != 0) goto switchD_00102dc6_caseD_4;
      cVar13 = (char)*register_list[bVar3];
      *(char *)register_list[bVar2] = cVar13;
LAB_00103084:
      bVar17 = cVar13 < '\0';
      bVar16 = cVar13 == '\0';
      pvVar6 = registe_ptr;
      goto joined_r0x001032d1;
    }
    puVar8 = register_list[bVar2];
    sVar10 = (short)*register_list[bVar3];
    goto LAB_0010321b;
  case 1:
    if (bVar12 == 2) {
      uVar11 = *(uint *)(code_ptr + (ulong)uVar11 + 3);
      puVar8 = register_list[bVar2];
      goto LAB_001032cd;
    }
    if (bVar12 != 1) {
      if ((bVar1 & 0xf) != 0) goto switchD_00102dc6_caseD_4;
      cVar13 = code_ptr[uVar11 + 3];
      *(char *)register_list[bVar2] = cVar13;
      goto LAB_00103084;
    }
    sVar10 = *(short *)(code_ptr + (ulong)uVar11 + 3);
    puVar8 = register_list[bVar2];
LAB_0010321b:
    *(short *)puVar8 = sVar10;
    bVar17 = sVar10 < 0;
    bVar16 = sVar10 == 0;
joined_r0x001032d1:
    if (bVar16) {
      pvVar6->flag[0] = '\0';
      return 1;
    }
    pvVar6->flag[0] = '\x01';
    if (!bVar16 && !bVar17) {
      pvVar6->flag[1] = '\x01';
      return 1;
    }
    pvVar6->flag[1] = '\0';
    return 1;
  case 2:
    bVar3 = (byte)code_ptr[uVar11 + 3] >> 4;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar12 == 2) {
      uVar11 = *(uint *)(data_ptr + *register_list[bVar3]);
LAB_001031e3:
      puVar8 = register_list[bVar2];
LAB_00103269:
      *puVar8 = uVar11;
      goto LAB_0010326b;
    }
    if (bVar12 != 1) {
      if ((bVar1 & 0xf) != 0) goto switchD_00102dc6_caseD_4;
      cVar13 = data_ptr[*register_list[bVar3]];
LAB_00102f4b:
      *(char *)register_list[bVar2] = cVar13;
      pvVar6 = registe_ptr;
      goto LAB_0010326b;
    }
    uVar9 = *(undefined2 *)(data_ptr + *register_list[bVar3]);
    goto LAB_0010316d;
  case 3:
    bVar1 = code_ptr[uVar11 + 3];
    bVar12 = bVar1 >> 4;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if ((bVar1 & 0xf) == 2) {
      *(uint *)(data_ptr + *register_list[bVar2]) = *register_list[bVar12];
    }
    else if ((bVar1 & 0xf) == 1) {
      *(short *)(data_ptr + *register_list[bVar2]) = (short)*register_list[bVar12];
    }
    else {
      if ((bVar1 & 0xf) != 0) goto switchD_00102dc6_caseD_4;
      data_ptr[*register_list[bVar2]] = (char)*register_list[bVar12];
      pvVar6 = registe_ptr;
    }
    break;
  default:
    goto switchD_00102dc6_caseD_4;
  case 7:
    bVar3 = (byte)code_ptr[uVar11 + 3] >> 4;
    iVar15 = (int)*(short *)(code_ptr + (ulong)uVar11 + 5);
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar12 == 2) {
      uVar11 = *(uint *)(data_ptr + (ulong)*register_list[bVar3] + (long)iVar15);
      goto LAB_001031e3;
    }
    if (bVar12 != 1) {
      if ((bVar1 & 0xf) != 0) goto switchD_00102dc6_caseD_4;
      cVar13 = data_ptr[iVar15 + *register_list[bVar3]];
      goto LAB_00102f4b;
    }
    uVar9 = *(undefined2 *)(data_ptr + (ulong)*register_list[bVar3] + (long)iVar15);
LAB_0010316d:
    puVar8 = register_list[bVar2];
LAB_001031a1:
    *(undefined2 *)puVar8 = uVar9;
LAB_0010326b:
    if (pvVar6->flag[0xe] == '\x01') {
      data_ptr = pcVar5;
    }
    return 1;
  case 8:
    bVar1 = code_ptr[uVar11 + 6];
    bVar12 = bVar1 >> 4;
    lVar14 = (long)*(short *)(code_ptr + (ulong)uVar11 + 4);
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if ((bVar1 & 0xf) == 2) {
      *(uint *)(data_ptr + (ulong)*register_list[bVar2] + lVar14) = *register_list[bVar12];
    }
    else if ((bVar1 & 0xf) == 1) {
      *(short *)(data_ptr + (ulong)*register_list[bVar2] + lVar14) = (short)*register_list[bVar12];
    }
    else {
      if ((bVar1 & 0xf) != 0) {
        return 1;
      }
      data_ptr[(ulong)*register_list[bVar2] + lVar14] = (char)*register_list[bVar12];
      pvVar6 = registe_ptr;
    }
    break;
  case 9:
    bVar3 = (byte)code_ptr[uVar11 + 3] >> 4;
    bVar1 = code_ptr[uVar11 + 4];
    bVar12 = bVar1 >> 4;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if ((bVar1 & 0xf) == 2) {
      *(uint *)(data_ptr + (ulong)*register_list[bVar3] + (ulong)*register_list[bVar2]) =
           *register_list[bVar12];
    }
    else if ((bVar1 & 0xf) == 1) {
      *(short *)(data_ptr + (ulong)*register_list[bVar3] + (ulong)*register_list[bVar2]) =
           (short)*register_list[bVar12];
    }
    else {
      if ((bVar1 & 0xf) != 0) goto switchD_00102dc6_caseD_4;
      data_ptr[(ulong)*register_list[bVar3] + (ulong)*register_list[bVar2]] =
           (char)*register_list[bVar12];
      pvVar6 = registe_ptr;
    }
    break;
  case 10:
    bVar3 = (byte)code_ptr[uVar11 + 3] >> 4;
    bVar4 = (byte)code_ptr[uVar11 + 4] >> 4;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar12 == 2) {
      puVar8 = register_list[bVar2];
      uVar11 = *(uint *)(data_ptr + (ulong)*register_list[bVar3] + (ulong)*register_list[bVar4]);
      goto LAB_00103269;
    }
    if (bVar12 != 1) {
      if ((bVar1 & 0xf) != 0) goto switchD_00102dc6_caseD_4;
      *(char *)register_list[bVar2] =
           data_ptr[(ulong)*register_list[bVar3] + (ulong)*register_list[bVar4]];
      pvVar6 = registe_ptr;
      goto LAB_0010326b;
    }
    puVar8 = register_list[bVar2];
    uVar9 = *(undefined2 *)(data_ptr + (ulong)*register_list[bVar3] + (ulong)*register_list[bVar4]);
    goto LAB_001031a1;
  }
  if (pvVar6->flag[0xe] != '\x01') {
    return 1;
  }
  data_ptr = pcVar5;
  return 1;
}

Assistant:

int do_mov() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low= (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;

	uint8_t o_low = (uint8_t)code_ptr[registe_ptr->IP + 1] % 0x10;

	switch (o_low)//操作类型
	{
	case '\x00': {//mov R,R  ---->0
		//
		uint8_t highb = (uint8_t)(code_ptr[registe_ptr->IP + 3]) / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x01': {//mov R,i   ----->1
		if (low == 0)//低位运算
		{
			unsigned temp = code_ptr[registe_ptr->IP + 2 + 1];//获得立即数
			char *R = (char *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(short*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x02': {//R,[R] ----->2
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			char temp = data_ptr[value];//获取数据段的内容
			char *R = (char *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			int16_t temp = *(int16_t*)(data_ptr + value);//获取数据段的内容
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			unsigned temp = *(unsigned*)(data_ptr + value);//获取数据段的内容
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x03': {//[R],R----->3
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			char *temp = data_ptr + value;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x07': {//R, [R + i]----->07
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		short i = *(short*)(code_ptr + registe_ptr->IP + 5);//获取立即数

		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			char temp = data_ptr[i + value];//获取数据段的内容
			char *R = (char *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			int16_t temp = *(int16_t*)(data_ptr + i + value);//获取数据段的内容
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			unsigned temp = *(unsigned*)(data_ptr + i + value);//获取数据段的内容
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x08': {//[R+i],R----->08
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 6] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 6] / 0x10;
		short i = *(short*)(code_ptr + registe_ptr->IP + 4);//获取立即数

		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			char *temp = data_ptr + i + value;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + i + value);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + i + value);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		break;
	}
	case'\x09': {//mov [R+R],R----->09
		uint8_t lowb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 4] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 4] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			char *temp = data_ptr + value + value1;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value + value1);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value + value1);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x0a': {//mov R,[R+R]----->0a
		uint8_t lowb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 4] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 4] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			char *temp = data_ptr + value + value1;//获取数据指针
			char *R = (char *)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value + value1);//获取数据指针
			int16_t *R = (int16_t*)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value + value1);//获取数据指针
			unsigned *R = (unsigned*)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}

	}
	default: {
		throw(LVM_EXECUTE_ERROR);
		break;
	}
	}
	return LVM_SUCCESS;

}